

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O3

Field * __thiscall
google::protobuf::util::converter::ProtoWriter::Lookup
          (ProtoWriter *this,StringPiece unnormalized_name)

{
  ProtoElement *pPVar1;
  Field *pFVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var5;
  long lVar6;
  char *pcVar7;
  LocationTrackerInterface *pLVar8;
  ErrorListener *pEVar9;
  char *pcVar10;
  undefined8 uVar11;
  long lVar4;
  
  lVar6 = unnormalized_name.length_;
  pcVar7 = unnormalized_name.ptr_;
  iVar3 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  if (lVar4 == 0) {
    pPVar1 = (this->element_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
             ._M_head_impl;
    pEVar9 = this->listener_;
    if (pPVar1 == (ProtoElement *)0x0) {
      pLVar8 = (this->tracker_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
               ._M_head_impl;
    }
    else {
      pLVar8 = &pPVar1->super_LocationTrackerInterface;
    }
    pp_Var5 = pEVar9->_vptr_ErrorListener;
    pcVar10 = "Root element must be a message.";
    uVar11 = 0x1f;
  }
  else {
    if (lVar6 == 0) {
      pFVar2 = *(Field **)(lVar4 + 0x28);
      if (pFVar2 == (Field *)0x0) {
        pPVar1 = (this->element_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                 ._M_head_impl;
        if (pPVar1 == (ProtoElement *)0x0) {
          pLVar8 = (this->tracker_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                   .
                   super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                   ._M_head_impl;
        }
        else {
          pLVar8 = &pPVar1->super_LocationTrackerInterface;
        }
        (*this->listener_->_vptr_ErrorListener[2])
                  (this->listener_,pLVar8,pcVar7,0,"Proto fields must have a name.",0x1e);
        return *(Field **)(lVar4 + 0x28);
      }
      if (pFVar2->cardinality_ != 3) {
        pPVar1 = (this->element_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                 ._M_head_impl;
        if (pPVar1 == (ProtoElement *)0x0) {
          pLVar8 = (this->tracker_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                   .
                   super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                   ._M_head_impl;
        }
        else {
          pLVar8 = &pPVar1->super_LocationTrackerInterface;
        }
        (*this->listener_->_vptr_ErrorListener[2])
                  (this->listener_,pLVar8,pcVar7,0,"Proto fields must have a name.",0x1e);
        return (Field *)0x0;
      }
      return pFVar2;
    }
    iVar3 = (*this->typeinfo_->_vptr_TypeInfo[5])
                      (this->typeinfo_,*(undefined8 *)(lVar4 + 0x40),pcVar7,lVar6);
    if ((Field *)CONCAT44(extraout_var_00,iVar3) != (Field *)0x0) {
      return (Field *)CONCAT44(extraout_var_00,iVar3);
    }
    if (this->ignore_unknown_fields_ != false) {
      return (Field *)0x0;
    }
    pPVar1 = (this->element_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
             ._M_head_impl;
    pEVar9 = this->listener_;
    if (pPVar1 == (ProtoElement *)0x0) {
      pLVar8 = (this->tracker_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
               ._M_head_impl;
    }
    else {
      pLVar8 = &pPVar1->super_LocationTrackerInterface;
    }
    pp_Var5 = pEVar9->_vptr_ErrorListener;
    pcVar10 = "Cannot find field.";
    uVar11 = 0x12;
  }
  (*pp_Var5[2])(pEVar9,pLVar8,pcVar7,lVar6,pcVar10,uVar11);
  return (Field *)0x0;
}

Assistant:

const google::protobuf::Field* ProtoWriter::Lookup(
    StringPiece unnormalized_name) {
  ProtoElement* e = element();
  if (e == nullptr) {
    InvalidName(unnormalized_name, "Root element must be a message.");
    return nullptr;
  }
  if (unnormalized_name.empty()) {
    // Objects in repeated field inherit the same field descriptor.
    if (e->parent_field() == nullptr) {
      InvalidName(unnormalized_name, "Proto fields must have a name.");
    } else if (!IsRepeated(*e->parent_field())) {
      InvalidName(unnormalized_name, "Proto fields must have a name.");
      return nullptr;
    }
    return e->parent_field();
  }
  const google::protobuf::Field* field =
      typeinfo_->FindField(&e->type(), unnormalized_name);
  if (field == nullptr && !ignore_unknown_fields_) {
    InvalidName(unnormalized_name, "Cannot find field.");
  }
  return field;
}